

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excitation_generation.cc
# Opt level: O0

bool __thiscall
sptk::ExcitationGeneration::Get
          (ExcitationGeneration *this,double *excitation,double *pulse,double *noise,double *pitch)

{
  byte bVar1;
  reference pvVar2;
  ulong uVar3;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  value_type *in_R8;
  double dVar4;
  double pulse_in_current_point;
  double noise_in_current_point;
  vector<double,_std::allocator<double>_> tmp;
  double pitch_in_current_point;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  double local_68;
  int local_60;
  vector<double,_std::allocator<double>_> local_50;
  value_type local_38;
  value_type *local_30;
  double *local_28;
  double *local_20;
  double *local_18;
  byte local_1;
  
  if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
    local_1 = 0;
  }
  else {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x1065bb);
    bVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x20))(*(long **)(in_RDI + 8),&local_50);
    if (((bVar1 & 1) == 0) ||
       (pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,0),
       *pvVar2 <= 0.0 && *pvVar2 != 0.0)) {
      local_1 = 0;
      local_60 = 1;
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,0);
      local_38 = *pvVar2;
      local_60 = 0;
    }
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff90);
    if (local_60 == 0) {
      local_68 = 0.0;
      if ((*(long *)(in_RDI + 0x10) == 0) ||
         (uVar3 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))
                            (*(long **)(in_RDI + 0x10),&local_68), (uVar3 & 1) != 0)) {
        if (local_30 != (value_type *)0x0) {
          *local_30 = local_38;
        }
        if (local_28 != (double *)0x0) {
          *local_28 = local_68;
        }
        dVar4 = InputSourceInterpolationWithMagicNumber::GetMagicNumber
                          (*(InputSourceInterpolationWithMagicNumber **)(in_RDI + 8));
        if ((dVar4 != local_38) || (NAN(dVar4) || NAN(local_38))) {
          if (*(double *)(in_RDI + 0x20) < 1.0) {
            dVar4 = 0.0;
          }
          else {
            *(double *)(in_RDI + 0x20) = *(double *)(in_RDI + 0x20) - 1.0;
            dVar4 = sqrt(local_38);
          }
          if (local_18 != (double *)0x0) {
            *local_18 = dVar4;
          }
          if (local_20 != (double *)0x0) {
            *local_20 = dVar4;
          }
          *(double *)(in_RDI + 0x20) = 1.0 / local_38 + *(double *)(in_RDI + 0x20);
          local_1 = 1;
        }
        else {
          *(undefined8 *)(in_RDI + 0x20) = 0x3ff0000000000000;
          if (local_18 != (double *)0x0) {
            *local_18 = local_68;
          }
          if (local_20 != (double *)0x0) {
            *local_20 = 0.0;
          }
          local_1 = 1;
        }
      }
      else {
        local_1 = 0;
      }
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ExcitationGeneration::Get(double* excitation, double* pulse, double* noise,
                               double* pitch) {
  if (!is_valid_) {
    return false;
  }

  // Get pitch.
  double pitch_in_current_point;
  {
    std::vector<double> tmp;
    if (!input_source_->Get(&tmp) || tmp[0] < 0.0) {
      return false;
    }
    pitch_in_current_point = tmp[0];
  }

  // Get noise.
  double noise_in_current_point(0.0);
  if (random_generation_ && !random_generation_->Get(&noise_in_current_point)) {
    return false;
  }

  if (pitch) {
    *pitch = pitch_in_current_point;
  }
  if (noise) {
    *noise = noise_in_current_point;
  }

  // If unvoiced point, return white noise.
  if (input_source_->GetMagicNumber() == pitch_in_current_point) {
    phase_ = 1.0;
    if (excitation) {
      *excitation = noise_in_current_point;
    }
    if (pulse) {
      *pulse = 0.0;
    }
    return true;
  }

  // If voiced point, return pulse or zero.
  double pulse_in_current_point;
  if (1.0 <= phase_) {
    phase_ -= 1.0;
    pulse_in_current_point = std::sqrt(pitch_in_current_point);
  } else {
    pulse_in_current_point = 0.0;
  }

  if (excitation) {
    *excitation = pulse_in_current_point;
  }
  if (pulse) {
    *pulse = pulse_in_current_point;
  }

  // Proceed phase.
  phase_ += 1.0 / pitch_in_current_point;

  return true;
}